

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSat.c
# Opt level: O2

Vec_Int_t * Ssc_ManFindPivotSat(Ssc_Man_t *p)

{
  int iVar1;
  Vec_Int_t *vPattern;
  
  iVar1 = sat_solver_solve(p->pSat,(lit *)0x0,(lit *)0x0,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar1 == -1) {
    vPattern = (Vec_Int_t *)0x1;
  }
  else if (iVar1 == 1) {
    vPattern = Vec_IntAlloc(p->pFraig->vCis->nSize);
    Ssc_ManCollectSatPattern(p,vPattern);
  }
  else {
    if (iVar1 != 0) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscSat.c"
                    ,0x14b,"Vec_Int_t *Ssc_ManFindPivotSat(Ssc_Man_t *)");
    }
    vPattern = (Vec_Int_t *)0x0;
  }
  return vPattern;
}

Assistant:

Vec_Int_t * Ssc_ManFindPivotSat( Ssc_Man_t * p )
{
    Vec_Int_t * vInit;
    int status = sat_solver_solve( p->pSat, NULL, NULL, p->pPars->nBTLimit, 0, 0, 0 );
    if ( status == l_False )
        return (Vec_Int_t *)(ABC_PTRINT_T)1;
    if ( status == l_Undef )
        return NULL;
    assert( status == l_True );
    vInit = Vec_IntAlloc( Gia_ManCiNum(p->pFraig) );
    Ssc_ManCollectSatPattern( p, vInit );
    return vInit;
}